

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O2

int nn_xsub_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  uint uVar1;
  
  if (level == 0x21) {
    if (option == 2) {
      uVar1 = nn_trie_unsubscribe((nn_trie *)&self[0x19].sock,(uint8_t *)optval,optvallen);
    }
    else {
      if (option != 1) goto LAB_001251b3;
      uVar1 = nn_trie_subscribe((nn_trie *)&self[0x19].sock,(uint8_t *)optval,optvallen);
    }
    uVar1 = uVar1 & (int)uVar1 >> 0x1f;
  }
  else {
LAB_001251b3:
    uVar1 = 0xffffffa4;
  }
  return uVar1;
}

Assistant:

static int nn_xsub_setopt (struct nn_sockbase *self, int level, int option,
        const void *optval, size_t optvallen)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    if (level != NN_SUB)
        return -ENOPROTOOPT;

    if (option == NN_SUB_SUBSCRIBE) {
        rc = nn_trie_subscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    if (option == NN_SUB_UNSUBSCRIBE) {
        rc = nn_trie_unsubscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    return -ENOPROTOOPT;
}